

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skiplist.hpp
# Opt level: O1

ostream * operator<<(ostream *out,skiplist<DictKey,_std::less<DictKey>_> *sl)

{
  uint uVar1;
  pointer ppSVar2;
  char cVar3;
  ostream oVar4;
  mapped_type *pmVar5;
  uint *puVar6;
  ostream *poVar7;
  uint uVar8;
  int iVar9;
  SLNode<DictKey> *pSVar10;
  int iVar11;
  pointer ppSVar12;
  _Rb_tree<DictKey,_std::pair<const_DictKey,_int>,_std::_Select1st<std::pair<const_DictKey,_int>_>,_std::less<DictKey>,_std::allocator<std::pair<const_DictKey,_int>_>_>
  local_68;
  
  ppSVar2 = (sl->key).super__Vector_base<SLNode<DictKey>_*,_std::allocator<SLNode<DictKey>_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  cVar3 = (char)out;
  if (ppSVar2 !=
      (sl->key).super__Vector_base<SLNode<DictKey>_*,_std::allocator<SLNode<DictKey>_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_68._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_68._M_impl.super__Rb_tree_header._M_header;
    local_68._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_68._M_impl._0_8_ = 0;
    local_68._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_68._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    local_68._M_impl.super__Rb_tree_header._M_node_count = 0;
    pSVar10 = (*ppSVar2)->next;
    iVar11 = 0;
    local_68._M_impl.super__Rb_tree_header._M_header._M_right =
         local_68._M_impl.super__Rb_tree_header._M_header._M_left;
    if (pSVar10 != (SLNode<DictKey> *)0x0) {
      do {
        pmVar5 = std::
                 map<DictKey,_int,_std::less<DictKey>,_std::allocator<std::pair<const_DictKey,_int>_>_>
                 ::operator[]((map<DictKey,_int,_std::less<DictKey>,_std::allocator<std::pair<const_DictKey,_int>_>_>
                               *)&local_68,&pSVar10->val);
        *pmVar5 = iVar11;
        iVar11 = iVar11 + 1;
        pSVar10 = pSVar10->next;
      } while (pSVar10 != (SLNode<DictKey> *)0x0);
    }
    ppSVar2 = (sl->key).super__Vector_base<SLNode<DictKey>_*,_std::allocator<SLNode<DictKey>_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    ppSVar12 = (sl->key).super__Vector_base<SLNode<DictKey>_*,_std::allocator<SLNode<DictKey>_*>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    while (ppSVar12 != ppSVar2) {
      std::__ostream_insert<char,std::char_traits<char>>(out,"S",1);
      pSVar10 = ppSVar12[-1];
      ppSVar12 = ppSVar12 + -1;
      uVar8 = 0xffffffff;
      while (pSVar10 = pSVar10->next, pSVar10 != (SLNode<DictKey> *)0x0) {
        puVar6 = (uint *)std::
                         map<DictKey,_int,_std::less<DictKey>,_std::allocator<std::pair<const_DictKey,_int>_>_>
                         ::operator[]((map<DictKey,_int,_std::less<DictKey>,_std::allocator<std::pair<const_DictKey,_int>_>_>
                                       *)&local_68,&pSVar10->val);
        uVar1 = *puVar6;
        if (1 < (int)(uVar1 - uVar8)) {
          iVar9 = ~uVar8 + uVar1;
          do {
            std::__ostream_insert<char,std::char_traits<char>>(out,"----",4);
            iVar9 = iVar9 + -1;
          } while (iVar9 != 0);
        }
        std::__ostream_insert<char,std::char_traits<char>>(out,"-",1);
        poVar7 = out + *(long *)(*(long *)out + -0x18);
        if (out[*(long *)(*(long *)out + -0x18) + 0xe1] == (ostream)0x0) {
          oVar4 = (ostream)std::ios::widen((char)poVar7);
          poVar7[0xe0] = oVar4;
          poVar7[0xe1] = (ostream)0x1;
        }
        poVar7[0xe0] = (ostream)0x2d;
        *(undefined8 *)(out + *(long *)(*(long *)out + -0x18) + 0x10) = 3;
        operator<<(out,&pSVar10->val);
        uVar8 = uVar1;
      }
      if (1 < (int)(iVar11 - uVar8)) {
        iVar9 = (iVar11 + -1) - uVar8;
        do {
          std::__ostream_insert<char,std::char_traits<char>>(out,"----",4);
          iVar9 = iVar9 + -1;
        } while (iVar9 != 0);
      }
      std::__ostream_insert<char,std::char_traits<char>>(out,"-E",2);
      std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar3);
      std::ostream::put(cVar3);
      std::ostream::flush();
    }
    std::
    _Rb_tree<DictKey,_std::pair<const_DictKey,_int>,_std::_Select1st<std::pair<const_DictKey,_int>_>,_std::less<DictKey>,_std::allocator<std::pair<const_DictKey,_int>_>_>
    ::~_Rb_tree(&local_68);
    return out;
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,"EMPTY SKIPLIST",0xe);
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar3);
  std::ostream::put(cVar3);
  poVar7 = (ostream *)std::ostream::flush();
  return poVar7;
}

Assistant:

std::ostream &operator<<(std::ostream &out, const skiplist<T, X>& sl) {
    if (sl.key.empty()) {
        return out << "EMPTY SKIPLIST" << std::endl;
    }

    // store mapping of node->index in a map
    std::map<T, int> index_store{};
    auto bottom_it = (*(sl.key.begin()))->next;
    int cur_index = 0;
    while (bottom_it) {
        index_store[bottom_it->val] = cur_index;
        cur_index++;
        bottom_it = bottom_it->next;
    }

    auto level = sl.key.rbegin();
    auto end = sl.key.rend();
    while(level != end) {
        // S denotes start of level, could be something different
        out << "S";

        // to store previous element's index
        // and current element's index
        int index = -1, next_index;
        // skip the first element - it is always 0
        auto it = (*level)->next;
        // iterate through the list at this level
        while (it) {
            next_index = index_store[it->val];

            // filler to align it correctly
            // when elements in between don't exist at this level
            for (int i = 1; i < next_index - index; ++i) {
                out << "----";
            }

            // width of printed element is hardcoded to 3 for now
            // the padding is filled with ""-"
            out << "-" << std::setfill('-') << std::setw(3) << it->val;
            it = it->next;

            index = next_index;
        }
        next_index = cur_index;

        for (int i = 1; i < next_index - index; ++i) {
            out << "----";
        }

        out << "-E";

        out << std::endl;

        level++;
    }

    return out;
}